

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O1

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  yysymbol_kind_t yVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  char *yyres;
  int iVar12;
  long lVar13;
  char *__s;
  bool bVar14;
  yysymbol_kind_t yyarg [5];
  yysymbol_kind_t local_58;
  int local_54 [7];
  char **local_38;
  
  yVar2 = yyctx->yytoken;
  uVar8 = 0;
  if (yVar2 != YYSYMBOL_YYEMPTY) {
    iVar11 = (int)yypact[*yyctx->yyssp];
    iVar4 = 0;
    if (iVar11 != -0x21) {
      iVar7 = -iVar11;
      iVar4 = 0;
      if (-1 < yypact[*yyctx->yyssp]) {
        iVar7 = 0;
      }
      iVar12 = 0x2e;
      if (0xbb - iVar11 < 0x2e) {
        iVar12 = 0xbb - iVar11;
      }
      if (iVar7 < iVar12) {
        uVar8 = (ulong)iVar7;
        iVar4 = 0;
        do {
          if ((uVar8 != 1) &&
             (uVar8 == "\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                       [(long)iVar11 + uVar8])) {
            if (iVar4 == 4) {
              iVar4 = 0;
              goto LAB_0010b535;
            }
            lVar13 = (long)iVar4;
            iVar4 = iVar4 + 1;
            local_54[lVar13] = (int)uVar8;
          }
          uVar8 = uVar8 + 1;
        } while ((long)iVar12 != uVar8);
      }
    }
    if (iVar4 == 0) {
      local_54[0] = -2;
    }
LAB_0010b535:
    uVar8 = (ulong)(iVar4 + 1);
    local_58 = yVar2;
    if (iVar4 == -2) {
      uVar8 = 0xfffffffe;
    }
  }
  __s = "syntax error";
  iVar4 = (int)uVar8;
  switch(iVar4) {
  case 1:
    __s = "syntax error, unexpected %s";
    break;
  case 2:
    __s = "syntax error, unexpected %s, expecting %s";
    break;
  case 3:
    __s = "syntax error, unexpected %s, expecting %s or %s";
    break;
  case 4:
    __s = "syntax error, unexpected %s, expecting %s or %s or %s";
    break;
  case 5:
    __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
    break;
  case -2:
    return iVar4;
  }
  local_38 = yymsg;
  sVar5 = strlen(__s);
  lVar13 = (sVar5 - (long)(iVar4 * 2)) + 1;
  bVar14 = 0 < iVar4;
  if (0 < iVar4) {
    lVar6 = yytnamerr((char *)0x0,yytname[local_58]);
    lVar10 = 0;
    if (-1 < lVar6) {
      lVar10 = lVar6;
    }
    lVar13 = lVar10 + lVar13;
    if (-1 < lVar6) {
      uVar3 = 1;
      do {
        uVar9 = uVar3;
        if (uVar8 == uVar9) break;
        lVar6 = yytnamerr((char *)0x0,yytname[local_54[uVar9 - 1]]);
        lVar10 = 0;
        if (-1 < lVar6) {
          lVar10 = lVar6;
        }
        lVar13 = lVar13 + lVar10;
        uVar3 = uVar9 + 1;
      } while (-1 < lVar6);
      bVar14 = uVar9 < uVar8;
    }
  }
  iVar11 = -2;
  if (!bVar14) {
    if (lVar13 <= *yymsg_alloc) {
      yyres = *local_38;
      iVar11 = 0;
      do {
        cVar1 = *__s;
        *yyres = cVar1;
        lVar13 = 1;
        if (cVar1 == '%') {
          if ((__s[1] == 's') && (iVar11 < iVar4)) {
            lVar13 = (long)iVar11;
            iVar11 = iVar11 + 1;
            lVar13 = yytnamerr(yyres,yytname[local_54[lVar13 + -1]]);
            lVar10 = 2;
          }
          else {
            lVar10 = 1;
          }
        }
        else {
          lVar10 = 1;
          if (cVar1 == '\0') {
            return 0;
          }
        }
        yyres = yyres + lVar13;
        __s = __s + lVar10;
      } while( true );
    }
    lVar10 = lVar13 * 2;
    lVar6 = 0x7fffffffffffffff;
    if (lVar13 == lVar10 || SBORROW8(lVar13,lVar10) != 0 < lVar13) {
      lVar6 = lVar10;
    }
    *yymsg_alloc = lVar6;
    iVar11 = -1;
  }
  return iVar11;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}